

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.c
# Opt level: O0

sexp_conflict
sexp_make_parameter(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict init,
                   sexp_conflict conv)

{
  sexp_conflict psVar1;
  undefined8 in_RCX;
  undefined8 in_RSI;
  long in_RDI;
  undefined8 in_R8;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_conflict cell;
  sexp_conflict res;
  undefined8 *local_50;
  undefined8 local_48;
  undefined8 local_40 [2];
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_18;
  long local_10;
  
  local_40[0] = 0x43e;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(&local_50,0,0x10);
  local_50 = local_40;
  local_48 = *(undefined8 *)(local_10 + 0x6080);
  *(undefined8 ***)(local_10 + 0x6080) = &local_50;
  local_40[0] = sexp_cons_op(local_10,0,2,0x3e,local_28);
  psVar1 = (sexp_conflict)
           sexp_make_opcode(local_10,local_18,0x3e,0x15,0x29,1,3,1,1,1,local_40[0],local_30,0);
  *(undefined8 *)(local_10 + 0x6080) = local_48;
  return psVar1;
}

Assistant:

sexp sexp_make_parameter (sexp ctx, sexp self, sexp_sint_t n, sexp init, sexp conv) {
  sexp res;
  sexp_gc_var1(cell);
  sexp_gc_preserve1(ctx, cell);
  cell = sexp_cons(ctx, SEXP_FALSE, init);
  res = sexp_make_opcode(ctx, self, SEXP_FALSE, _I(SEXP_OPC_PARAMETER),
                         _I(SEXP_OP_PARAMETER_REF), SEXP_ZERO, SEXP_ONE,
                         _I(SEXP_OBJECT), _I(SEXP_OBJECT), SEXP_ZERO,
                         cell, conv, NULL);
  sexp_gc_release1(ctx);
  return res;
}